

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_foreach.c
# Opt level: O0

int mpt_properties_foreach
              (_func_int_void_ptr_mpt_property_ptr *get,void *obj,mpt_property_handler_t proc,
              void *data,int match)

{
  char *pcVar1;
  int iVar2;
  int err;
  uintptr_t pos;
  mpt_property prop;
  int match_local;
  void *data_local;
  mpt_property_handler_t proc_local;
  void *obj_local;
  _func_int_void_ptr_mpt_property_ptr *get_local;
  
  prop._buf._12_4_ = match;
  memset(&pos,0,0x30);
  prop.name = (char *)0x0;
  while( true ) {
    pcVar1 = prop.name;
    pos = 0;
    iVar2 = (*get)(obj,(mpt_property *)&pos);
    if (iVar2 < 0) {
      return (int)pcVar1 + -1;
    }
    prop.name = (char *)0x0;
    if ((((iVar2 != 0) && ((prop._buf._12_4_ & 0x10) != 0)) ||
        ((iVar2 == 0 && ((prop._buf._12_4_ & 0x20) != 0)))) &&
       (iVar2 = (*proc)(data,(mpt_property *)&pos), iVar2 < 0)) break;
    prop.name = pcVar1 + 1;
  }
  return iVar2;
}

Assistant:

extern int mpt_properties_foreach(int (*get)(void *, MPT_STRUCT(property) *), void *obj, MPT_TYPE(property_handler) proc, void *data, int match)
{
	MPT_STRUCT(property) prop = MPT_PROPERTY_INIT;
	uintptr_t pos = 0;
	int err;
	
	prop.name = 0;
	prop.desc = 0;
	
	while ((err = get(obj, &prop)) >= 0) {
		prop.desc = 0;
		if (((err && (match & MPT_ENUM(TraverseChange)))
		     || (!err && (match & MPT_ENUM(TraverseDefault))))
		    && (err = proc(data, &prop)) < 0) {
			return err;
		}
		prop.name = 0;
		prop.desc = (void *)(++pos);
	}
	return pos - 1;
}